

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O1

void nni_vlog(nng_log_level level,nng_log_facility facility,char *msgid,char *msg,__va_list_tag *ap)

{
  char local_228 [8];
  char formatted [512];
  
  if (((facility != 0) && (level <= log_level)) && (log_level != NNG_LOG_NONE)) {
    vsnprintf(local_228,0x200,msg,ap);
    (*log_logger)(level,facility,msgid,local_228);
  }
  return;
}

Assistant:

static void
nni_vlog(nng_log_level level, nng_log_facility facility, const char *msgid,
    const char *msg, va_list ap)
{
	// nobody allowed to log at LOG_EMERG or using LOG_KERN
	if (level > log_level || log_level == 0 || facility == 0) {
		return;
	}
	char formatted[512];
	vsnprintf(formatted, sizeof(formatted), msg, ap);
	log_logger(level, facility, msgid, formatted);
}